

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_functions.h
# Opt level: O2

bool __thiscall sliding_puzzle::SlidingPuzzleState::Compare::operator()(Compare *this,Ptr *a,Ptr *b)

{
  element_type *peVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar3 = (long)(((a->
                  super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->state_).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = -1;
  lVar4 = 0;
  do {
    bVar2 = std::operator!=((vector<int,_std::allocator<int>_> *)(lVar3 + lVar4),
                            (vector<int,_std::allocator<int>_> *)
                            ((long)(((b->
                                     super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->state_).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar4));
    if (bVar2) break;
    peVar1 = (a->super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
    lVar3 = (long)(peVar1->state_).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x18;
  } while (lVar5 != ((long)(peVar1->state_).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - lVar3) / 0x18 + -1);
  return !bVar2;
}

Assistant:

bool operator()(const Ptr& a,
                    const Ptr& b) const
    {
      for (int i=0; i<a->state_.size(); ++i)
      {
        if (a->state_[i] != b->state_[i])
        {
          return false;
        }
        if (i == a->state_.size()-1)
        {
          return true;
        }
      }
    }